

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bridge.cpp
# Opt level: O3

int AF_ABridgeBall_A_BridgeOrbit
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  AActor *self;
  char *__assertion;
  bool bVar4;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004b275b;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004b2742:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004b275b:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_bridge.cpp"
                  ,0x77,
                  "int AF_ABridgeBall_A_BridgeOrbit(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  self = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (self != (AActor *)0x0) {
      pPVar3 = (self->super_DThinker).super_DObject.Class;
      if (pPVar3 == (PClass *)0x0) {
        iVar2 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
        pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
        (self->super_DThinker).super_DObject.Class = pPVar3;
      }
      bVar4 = pPVar3 != (PClass *)0x0;
      if (pPVar3 != pPVar1 && bVar4) {
        do {
          pPVar3 = pPVar3->ParentClass;
          bVar4 = pPVar3 != (PClass *)0x0;
          if (pPVar3 == pPVar1) break;
        } while (pPVar3 != (PClass *)0x0);
      }
      if (!bVar4) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_004b275b;
      }
      goto LAB_004b2733;
    }
  }
  else if (self != (AActor *)0x0) goto LAB_004b2742;
  self = (AActor *)0x0;
LAB_004b2733:
  BridgeOrbit(self);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(ABridgeBall, A_BridgeOrbit)
{
	PARAM_SELF_PROLOGUE(AActor);
	BridgeOrbit(self);
	return 0;
}